

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::exception::eval_error::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this)

{
  int iVar1;
  pointer pAVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t j;
  ulong uVar5;
  long lVar6;
  string local_1e8;
  string local_1c8;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  pcVar3 = (char *)(**(code **)(*(long *)this + 0x10))(this);
  std::operator<<((ostream *)&ss,pcVar3);
  if ((this->call_stack).
      super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->call_stack).
      super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    poVar4 = std::operator<<((ostream *)&ss,"during evaluation at (");
    poVar4 = std::operator<<(poVar4,(string *)
                                    (((this->call_stack).
                                      super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->location).filename
                                    .
                                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
    poVar4 = std::operator<<(poVar4," ");
    startpos<chaiscript::AST_Node_Trace>
              (&local_1e8,
               (this->call_stack).
               super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
               ._M_impl.super__Vector_impl_data._M_start);
    poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
    std::operator<<(poVar4,")\n");
    std::__cxx11::string::~string((string *)&local_1e8);
    poVar4 = std::operator<<((ostream *)&ss,'\n');
    poVar4 = std::operator<<(poVar4,(string *)&this->detail);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&ss,"  ");
    poVar4 = std::operator<<(poVar4,(string *)
                                    (((this->call_stack).
                                      super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->location).filename
                                    .
                                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
    poVar4 = std::operator<<(poVar4," (");
    startpos<chaiscript::AST_Node_Trace>
              (&local_1e8,
               (this->call_stack).
               super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
               ._M_impl.super__Vector_impl_data._M_start);
    poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
    poVar4 = std::operator<<(poVar4,") \'");
    AST_Node_Trace::pretty_print_abi_cxx11_
              (&local_1c8,
               (this->call_stack).
               super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
               ._M_impl.super__Vector_impl_data._M_start);
    poVar4 = std::operator<<(poVar4,(string *)&local_1c8);
    std::operator<<(poVar4,"\'");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    lVar6 = 0x60;
    for (uVar5 = 1;
        pAVar2 = (this->call_stack).
                 super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)(((long)(this->call_stack).
                               super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x60);
        uVar5 = uVar5 + 1) {
      iVar1 = *(int *)((long)&pAVar2->identifier + lVar6);
      if ((iVar1 != 10) && (iVar1 != 0x14)) {
        std::operator<<((ostream *)&ss,'\n');
        poVar4 = std::operator<<((ostream *)&ss,"  from ");
        poVar4 = std::operator<<(poVar4,*(string **)
                                         ((long)&(((this->call_stack).
                                                                                                      
                                                  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 location).filename.
                                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                         + lVar6));
        poVar4 = std::operator<<(poVar4," (");
        startpos<chaiscript::AST_Node_Trace>
                  (&local_1e8,
                   (AST_Node_Trace *)
                   ((long)&((this->call_stack).
                            super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                            ._M_impl.super__Vector_impl_data._M_start)->identifier + lVar6));
        poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
        poVar4 = std::operator<<(poVar4,") \'");
        AST_Node_Trace::pretty_print_abi_cxx11_
                  (&local_1c8,
                   (AST_Node_Trace *)
                   ((long)&((this->call_stack).
                            super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                            ._M_impl.super__Vector_impl_data._M_start)->identifier + lVar6));
        poVar4 = std::operator<<(poVar4,(string *)&local_1c8);
        std::operator<<(poVar4,"\'");
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      lVar6 = lVar6 + 0x60;
    }
  }
  std::operator<<((ostream *)&ss,'\n');
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty_print() const {
        std::ostringstream ss;

        ss << what();
        if (!call_stack.empty()) {
          ss << "during evaluation at (" << fname(call_stack[0]) << " " << startpos(call_stack[0]) << ")\n";
          ss << '\n'
             << detail << '\n';
          ss << "  " << fname(call_stack[0]) << " (" << startpos(call_stack[0]) << ") '" << pretty(call_stack[0]) << "'";
          for (size_t j = 1; j < call_stack.size(); ++j) {
            if (id(call_stack[j]) != chaiscript::AST_Node_Type::Block && id(call_stack[j]) != chaiscript::AST_Node_Type::File) {
              ss << '\n';
              ss << "  from " << fname(call_stack[j]) << " (" << startpos(call_stack[j]) << ") '" << pretty(call_stack[j]) << "'";
            }
          }
        }
        ss << '\n';
        return ss.str();
      }